

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fd_filter.cc
# Opt level: O0

void __thiscall
sptk::reaper::FdFilter::FdFilterInitialize
          (FdFilter *this,float input_freq,float corner_freq,bool do_highpass,float filter_dur,
          bool do_rate_conversion,char *spectrum_shape,float *spectrum_array,int n_magnitudes)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  int iVar12;
  void *pvVar13;
  char *pcVar14;
  ulong uVar15;
  char *in_RCX;
  byte in_DL;
  byte in_SIL;
  float *in_RDI;
  ulong uVar16;
  void *in_R8;
  int in_R9D;
  float in_XMM0_Da;
  float in_XMM1_Da;
  float in_XMM2_Da;
  float ftscale;
  int nf2;
  float fact;
  int nft;
  int nItems;
  float fs;
  char line [500];
  int ind;
  int n_spect;
  FILE *spec_stream;
  bool b_allocated;
  bool do_eq_filtering;
  int i;
  int pow2;
  float freq1;
  float ratio;
  float ratio_t;
  float *b;
  float beta;
  undefined8 in_stack_fffffffffffffd48;
  FFT *this_00;
  undefined4 in_stack_fffffffffffffd70;
  int in_stack_fffffffffffffd74;
  undefined1 invert;
  undefined4 in_stack_fffffffffffffd78;
  float in_stack_fffffffffffffd7c;
  undefined4 in_stack_fffffffffffffd80;
  float fVar17;
  undefined4 in_stack_fffffffffffffd84;
  float in_stack_fffffffffffffd8c;
  undefined4 in_stack_fffffffffffffd90;
  float in_stack_fffffffffffffd94;
  char local_268 [512];
  undefined1 local_68 [4];
  int local_64;
  FILE *local_60;
  byte local_56;
  byte local_55;
  float local_54;
  int local_50;
  float local_4c;
  float local_48;
  float local_44;
  void *local_40;
  float local_38;
  int local_34;
  void *local_30;
  char *local_28;
  byte local_19;
  float local_18;
  byte local_11;
  float local_10;
  float local_c;
  
  local_11 = in_SIL & 1;
  local_19 = in_DL & 1;
  local_38 = 0.0;
  local_40 = (void *)0x0;
  local_55 = 0;
  local_56 = 1;
  in_RDI[0x1e] = 1.4013e-45;
  in_RDI[0x1f] = 1.4013e-45;
  in_RDI[0xe] = 1.4013e-45;
  in_RDI[0xb] = 0.0;
  in_RDI[0xc] = 0.0;
  in_RDI[0xd] = 0.0;
  in_RDI[0xf] = in_XMM0_Da;
  local_4c = in_XMM0_Da;
  local_34 = in_R9D;
  local_30 = in_R8;
  local_28 = in_RCX;
  local_18 = in_XMM2_Da;
  local_10 = in_XMM1_Da;
  local_c = in_XMM0_Da;
  pvVar13 = operator_new__(44000);
  *(void **)in_RDI = pvVar13;
  pvVar13 = operator_new__(22000);
  *(void **)(in_RDI + 2) = pvVar13;
  if ((local_28 == (char *)0x0) && ((local_30 == (void *)0x0 || (local_34 < 2)))) {
    if ((local_19 & 1) == 0) {
      local_4c = local_c;
      if (local_c / 2.0 <= local_10) {
        fprintf(_stderr,"Unreasonable corner frequency specified to filter() (%f)\n",
                SUB84((double)local_10,0));
      }
    }
    else {
      local_4c = local_c;
    }
  }
  else {
    local_55 = 1;
  }
  if (local_28 == (char *)0x0) {
    if ((local_30 == (void *)0x0) || (local_34 < 2)) {
      if ((local_19 & 1) == 0) {
        local_38 = local_10 / local_4c;
        in_RDI[6] = (float)((int)(local_4c * local_18) | 1);
      }
      else {
        local_48 = local_10 / local_4c;
        RationalApproximation
                  ((FdFilter *)CONCAT44(in_stack_fffffffffffffd94,in_stack_fffffffffffffd90),
                   in_stack_fffffffffffffd8c,
                   (int *)CONCAT44(in_stack_fffffffffffffd84,in_stack_fffffffffffffd80),
                   (int *)CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78),
                   in_stack_fffffffffffffd74);
        local_44 = (float)(int)in_RDI[0x1e] / (float)(int)in_RDI[0x1f];
        if (ABS(1.0 - local_44) < 0.01) {
          fprintf(_stderr,"Input and output frequencies are essentially equal!\n");
        }
        in_RDI[0xf] = local_44 * local_4c;
        local_10 = in_RDI[0xf];
        in_RDI[6] = (float)((int)(local_4c * (float)(int)in_RDI[0x1e] * local_18) | 1);
        if (local_4c <= local_10) {
          local_38 = 0.5 / (float)(int)in_RDI[0x1e];
        }
        else {
          local_38 = (local_10 * 0.5) / ((float)(int)in_RDI[0x1e] * local_4c);
        }
      }
      auVar2._8_8_ = 0;
      auVar2._0_8_ = (long)((int)in_RDI[6] / 2 + 1);
      uVar15 = SUB168(auVar2 * ZEXT816(4),0);
      if (SUB168(auVar2 * ZEXT816(4),8) != 0) {
        uVar15 = 0xffffffffffffffff;
      }
      local_40 = operator_new__(uVar15);
      MakeLinearFir((FdFilter *)CONCAT44(in_stack_fffffffffffffd84,in_stack_fffffffffffffd80),
                    in_stack_fffffffffffffd7c,
                    (int *)CONCAT44(in_stack_fffffffffffffd74,in_stack_fffffffffffffd70),in_RDI);
      if (1 < (int)in_RDI[0x1e]) {
        fVar17 = in_RDI[0x1e];
        for (local_54 = (float)((int)in_RDI[6] / 2); -1 < (int)local_54;
            local_54 = (float)((int)local_54 + -1)) {
          *(float *)((long)local_40 + (long)(int)local_54 * 4) =
               (float)(int)fVar17 * *(float *)((long)local_40 + (long)(int)local_54 * 4);
        }
      }
    }
    else {
      in_RDI[6] = (float)(local_34 + -1);
      for (local_50 = 1; 1 << ((byte)local_50 & 0x1f) < (int)in_RDI[6] << 1; local_50 = local_50 + 1
          ) {
      }
      local_40 = local_30;
      local_56 = 0;
    }
    invert = (undefined1)((uint)in_stack_fffffffffffffd74 >> 0x18);
  }
  else {
    local_60 = fopen(local_28,"r");
    invert = (undefined1)((uint)in_stack_fffffffffffffd74 >> 0x18);
    if (local_60 == (FILE *)0x0) {
      fprintf(_stderr,"Can\'t open %s as a spectrum file\n",local_28);
    }
    else {
      pcVar14 = fgets(local_268,500,local_60);
      invert = (undefined1)((uint)in_stack_fffffffffffffd74 >> 0x18);
      if (pcVar14 == (char *)0x0) {
        fprintf(_stderr,"Bad format in spectrum file %s\n",local_28);
      }
      else {
        iVar12 = __isoc99_sscanf(local_268,"%d %d %f",&local_50,&local_64,&stack0xfffffffffffffd94);
        if ((iVar12 == 3) &&
           ((in_stack_fffffffffffffd94 != local_c ||
            (NAN(in_stack_fffffffffffffd94) || NAN(local_c))))) {
          fprintf(_stderr,"Filter spec (%f) does not match input frequency (%f)\n",
                  SUB84((double)in_stack_fffffffffffffd94,0),(double)local_c);
          fprintf(_stderr,"The filtering results will probably not be what you want!\n");
        }
        auVar1._8_8_ = 0;
        auVar1._0_8_ = (long)local_64;
        uVar15 = SUB168(auVar1 * ZEXT816(4),0);
        if (SUB168(auVar1 * ZEXT816(4),8) != 0) {
          uVar15 = 0xffffffffffffffff;
        }
        local_40 = operator_new__(uVar15);
        in_RDI[6] = (float)(local_64 + -1);
        for (local_54 = 0.0; invert = (undefined1)((uint)in_stack_fffffffffffffd74 >> 0x18),
            (int)local_54 < local_64; local_54 = (float)((int)local_54 + 1)) {
          pcVar14 = fgets(local_268,500,local_60);
          if ((pcVar14 == (char *)0x0) ||
             (iVar12 = __isoc99_sscanf(local_268,"%d %f",local_68,
                                       (void *)((long)local_40 + (long)(int)local_54 * 4)),
             iVar12 != 2)) {
            fprintf(_stderr,"Parsing error in spect ratio file %s\n",local_28);
          }
        }
      }
      fclose(local_60);
    }
  }
  in_RDI[7] = (float)((int)in_RDI[6] / 2);
  if ((local_55 & 1) == 0) {
    MirrorFilter((FdFilter *)CONCAT44(in_stack_fffffffffffffd84,in_stack_fffffffffffffd80),
                 (float *)CONCAT44(in_stack_fffffffffffffd7c,in_stack_fffffffffffffd78),(bool)invert
                );
    in_RDI[0x1c] = 1.79366e-43;
    local_50 = 7;
    while ((int)in_RDI[0x1c] < (int)in_RDI[6] << 1) {
      in_RDI[0x1c] = (float)((int)in_RDI[0x1c] << 1);
      local_50 = local_50 + 1;
    }
  }
  else {
    in_RDI[0x1c] = (float)((int)in_RDI[6] << 1);
    for (local_50 = 2; 1 << ((byte)local_50 & 0x1f) < (int)in_RDI[0x1c]; local_50 = local_50 + 1) {
    }
  }
  in_RDI[0x1d] = (float)((int)in_RDI[0x1c] / 2);
  this_00 = (FFT *)0x4;
  auVar3._8_8_ = 0;
  auVar3._0_8_ = (long)(int)in_RDI[0x1c];
  uVar15 = SUB168(auVar3 * ZEXT816(4),0);
  if (SUB168(auVar3 * ZEXT816(4),8) != 0) {
    uVar15 = 0xffffffffffffffff;
  }
  pvVar13 = operator_new__(uVar15);
  *(void **)(in_RDI + 0x14) = pvVar13;
  auVar4._8_8_ = 0;
  auVar4._0_8_ = (long)(int)in_RDI[0x1c];
  auVar8._8_8_ = 0;
  auVar8._0_8_ = this_00;
  uVar15 = SUB168(auVar4 * auVar8,0);
  if (SUB168(auVar4 * auVar8,8) != 0) {
    uVar15 = 0xffffffffffffffff;
  }
  pvVar13 = operator_new__(uVar15);
  *(void **)(in_RDI + 0x16) = pvVar13;
  auVar5._8_8_ = 0;
  auVar5._0_8_ = (long)(int)in_RDI[0x1c];
  auVar9._8_8_ = 0;
  auVar9._0_8_ = this_00;
  uVar15 = SUB168(auVar5 * auVar9,0);
  if (SUB168(auVar5 * auVar9,8) != 0) {
    uVar15 = 0xffffffffffffffff;
  }
  pvVar13 = operator_new__(uVar15);
  *(void **)(in_RDI + 0x18) = pvVar13;
  auVar6._8_8_ = 0;
  auVar6._0_8_ = (long)(int)in_RDI[0x1c];
  auVar10._8_8_ = 0;
  auVar10._0_8_ = this_00;
  uVar15 = SUB168(auVar6 * auVar10,0);
  if (SUB168(auVar6 * auVar10,8) != 0) {
    uVar15 = 0xffffffffffffffff;
  }
  pvVar13 = operator_new__(uVar15);
  *(void **)(in_RDI + 0x1a) = pvVar13;
  uVar16 = (ulong)(int)in_RDI[0x1c];
  uVar15 = uVar16 * 2;
  if (CARRY8(uVar16,uVar16)) {
    uVar15 = 0xffffffffffffffff;
  }
  pvVar13 = operator_new__(uVar15);
  *(void **)(in_RDI + 0x10) = pvVar13;
  in_RDI[0x20] = (float)(11000 / (long)(int)in_RDI[0x1e]);
  auVar7._8_8_ = 0;
  auVar7._0_8_ = (long)((int)in_RDI[6] + 22000 + (int)in_RDI[0x1c]);
  auVar11._8_8_ = 0;
  auVar11._0_8_ = this_00;
  uVar15 = SUB168(auVar7 * auVar11,0);
  if (SUB168(auVar7 * auVar11,8) != 0) {
    uVar15 = 0xffffffffffffffff;
  }
  pvVar13 = operator_new__(uVar15);
  *(void **)(in_RDI + 0x12) = pvVar13;
  fVar17 = 1.0 / (float)(int)in_RDI[0x1c];
  pvVar13 = operator_new(0x20);
  FFT::FFT(this_00,(int)((ulong)in_stack_fffffffffffffd48 >> 0x20));
  *(void **)(in_RDI + 0x22) = pvVar13;
  if ((local_55 & 1) == 0) {
    for (local_54 = 0.0; (int)local_54 <= (int)in_RDI[7]; local_54 = (float)((int)local_54 + 1)) {
      *(float *)(*(long *)(in_RDI + 0x18) + (long)(int)local_54 * 4) =
           fVar17 * *(float *)(*(long *)(in_RDI + 4) + (long)((int)local_54 + (int)in_RDI[7]) * 4);
      *(undefined4 *)(*(long *)(in_RDI + 0x1a) + (long)(int)local_54 * 4) = 0;
    }
    for (; (int)local_54 < (int)in_RDI[6]; local_54 = (float)((int)local_54 + 1)) {
      *(float *)(*(long *)(in_RDI + 0x18) +
                (long)(((int)in_RDI[0x1c] - (int)in_RDI[6]) + (int)local_54) * 4) =
           fVar17 * *(float *)(*(long *)(in_RDI + 4) +
                              (long)(((int)local_54 - (int)in_RDI[7]) + -1) * 4);
      *(undefined4 *)
       (*(long *)(in_RDI + 0x1a) + (long)(((int)in_RDI[0x1c] - (int)in_RDI[6]) + (int)local_54) * 4)
           = 0;
    }
    for (local_54 = in_RDI[7]; (int)local_54 < (int)in_RDI[0x1c] - (int)in_RDI[7];
        local_54 = (float)((int)local_54 + 1)) {
      *(undefined4 *)(*(long *)(in_RDI + 0x1a) + (long)(int)local_54 * 4) = 0;
      *(undefined4 *)(*(long *)(in_RDI + 0x18) + (long)(int)local_54 * 4) = 0;
    }
    FFT::fft(*(FFT **)(in_RDI + 0x22),*(float **)(in_RDI + 0x18),*(float **)(in_RDI + 0x1a));
  }
  else {
    for (local_54 = 0.0; (int)local_54 <= (int)in_RDI[6]; local_54 = (float)((int)local_54 + 1)) {
      *(float *)(*(long *)(in_RDI + 0x18) + (long)(int)local_54 * 4) =
           fVar17 * *(float *)((long)local_40 + (long)(int)local_54 * 4);
      *(undefined4 *)(*(long *)(in_RDI + 0x1a) + (long)(int)local_54 * 4) = 0;
    }
    for (; (int)local_54 < (int)in_RDI[0x1c]; local_54 = (float)((int)local_54 + 1)) {
      *(undefined4 *)(*(long *)(in_RDI + 0x18) + (long)(int)local_54 * 4) =
           *(undefined4 *)(*(long *)(in_RDI + 0x18) + (long)((int)in_RDI[0x1c] - (int)local_54) * 4)
      ;
      *(undefined4 *)(*(long *)(in_RDI + 0x1a) + (long)(int)local_54 * 4) = 0;
    }
  }
  if (((local_56 & 1) != 0) && (local_40 != (void *)0x0)) {
    operator_delete__(local_40);
  }
  return;
}

Assistant:

void FdFilter::FdFilterInitialize(float input_freq, float corner_freq,
                                  bool do_highpass, float filter_dur,
                                  bool do_rate_conversion,
                                  char *spectrum_shape, float *spectrum_array,
                                  int n_magnitudes) {
  float beta = 0.0, *b = NULL;
  float  ratio_t, ratio, freq1 = input_freq;
  int pow2, i;
  bool do_eq_filtering = false;
  bool b_allocated = true;

  insert_ = 1;
  decimate_ = 1;
  filter_state_ = 1;
  array_leftover_ = 0;
  array_index_ = 0;
  array_samples_used_ = 0;
  true_output_rate_ = input_freq;

  output_buffer_ = new int16_t[kIoBufferSize * 2];
  input_buffer_ = new int16_t[kIoBufferSize];

  if (spectrum_shape || (spectrum_array && (n_magnitudes > 1))) {
    do_eq_filtering = true;
  } else {
    if (do_rate_conversion) {
      freq1 = input_freq;
    } else {   /* it is just a symmetric FIR */
      if (corner_freq >= (freq1 = input_freq) / 2.0) {
        fprintf(stderr,
                "Unreasonable corner frequency specified to filter() (%f)\n",
                corner_freq);
      }
    }
  }

  if (spectrum_shape) {
    FILE *spec_stream = fopen(spectrum_shape, "r");
    if (spec_stream) {
      int n_spect, ind;
      char line[500];
      float fs;
      if (fgets(line, 500, spec_stream)) {
        int nItems = sscanf(line, "%d %d %f", &pow2, &n_spect, &fs);
        if ((nItems == 3) && (fs != input_freq)) {  // This should be a
                                                  // fatal error!
          fprintf(stderr,
                  "Filter spec (%f) does not match input frequency (%f)\n",
                  fs, input_freq);
          fprintf(stderr,
               "The filtering results will probably not be what you want!\n");
        }
        b = new float[n_spect];
        n_filter_coeffs_ = n_spect - 1;  // n_filter_coeffs_ represents actual
                                         // filter-kernel length,
                                         // instead of half filter
                                         // length when using external
                                         // filter.
        for (i = 0; i < n_spect; i++) {
          if ((!fgets(line, 500, spec_stream)) ||
             (sscanf(line, "%d %f", &ind, &(b[i])) != 2)) {
            fprintf(stderr, "Parsing error in spect ratio file %s\n",
                    spectrum_shape);
          }
        }
      } else {
        fprintf(stderr, "Bad format in spectrum file %s\n",
                             spectrum_shape);
      }
      fclose(spec_stream);
    } else {
      fprintf(stderr, "Can't open %s as a spectrum file\n",
                           spectrum_shape);
    }
  } else {
    // Note: n_magnitudes MUST be ((2^k)+1) for k > 1.
    if (spectrum_array && (n_magnitudes > 1)) {
      n_filter_coeffs_ = n_magnitudes - 1;
      int nft = n_filter_coeffs_ * 2;
      pow2 = 1;
      while ((1 << pow2) < nft) {
        pow2++;
      }
      b = spectrum_array;  // Note: b must not be deleted in this case!
      b_allocated = false;
    } else { /* it is not an eq filter */
      if (do_rate_conversion) {
        /* get a ratio of integers close to desired freq. ratio. */
        ratio = corner_freq/freq1;
        RationalApproximation(ratio, &insert_, &decimate_, kMaxDecimation);
        ratio_t = static_cast<float>(insert_) / decimate_;

        if (fabs(1.0 - ratio_t) < .01) {
          fprintf(stderr,
                  "Input and output frequencies are essentially equal!\n");
        }
        true_output_rate_ = ratio_t * freq1;
        // if (corner_freq != true_output_rate_) {
        //   fprintf(stderr,
        // "Warning: Output frequency obtained(%f) is not as requested(%f)\n",
        //    true_output_rate_, corner_freq);
        // }
        corner_freq = true_output_rate_;
        n_filter_coeffs_ = static_cast<int>(freq1 * insert_ * filter_dur) | 1;
        if (corner_freq < freq1)
          beta = (.5 * corner_freq)/(insert_ * freq1);
        else
          beta = .5/insert_;
      } else {
        beta = corner_freq/freq1;
        n_filter_coeffs_ = static_cast<int>(freq1 * filter_dur) | 1;
      }

      /* Generate the symmetric FIR filter coefficients. */
      b = new float[1 + (n_filter_coeffs_ / 2)];
      MakeLinearFir(beta, &n_filter_coeffs_, b);

      if (insert_ > 1) {  // Scale up filter coeffs. to maintain
                        // precision in output.
        float fact = insert_;
        for (i = n_filter_coeffs_ / 2; i >= 0; i--) b[i] *= fact;
      }
    }  // end else it is not an eq filter.
  }  // end else (a spectrum shape was not specified).

  n_filter_coeffs_by2_ = n_filter_coeffs_ / 2;

  if (!do_eq_filtering) { /* Is it a simple high- or low-pass filter? */
    MirrorFilter(b, do_highpass);
    int nf2 = n_filter_coeffs_ << 1;
    fft_size_ = 128;
    pow2 = 7;
    while (nf2 > fft_size_) {
      fft_size_ *= 2;
      pow2++;
    }
  } else {  // It is a filter with the magnitude response specified in b.
    fft_size_ = n_filter_coeffs_ * 2;
    pow2 = 2;
    while ((1 << pow2) < fft_size_)
      pow2++;
  }

  fft_size_by2_ = fft_size_ / 2;

  x_ = new float[fft_size_];
  y_ = new float[fft_size_];
  xf_ = new float[fft_size_];
  yf_ = new float[fft_size_];

  leftovers_ = new int16_t[fft_size_];
  max_input_ = kIoBufferSize / insert_;
  output_delayed_ = new float[(2 * kIoBufferSize)+n_filter_coeffs_+fft_size_];

  float ftscale = 1.0 / fft_size_;
  fft_ = new FFT(pow2);
  if (!do_eq_filtering) {
    // position the filter kernel to be symmetric about time=0
    // Note that this assumes an odd number of symmetric filter coefficients.
    for (i = 0; i <= n_filter_coeffs_by2_; i++) {
      xf_[i] = ftscale * filter_coeffs_[i+n_filter_coeffs_by2_];
      yf_[i] = 0.0;
    }
    for (; i < n_filter_coeffs_; i++) {
      xf_[fft_size_ - n_filter_coeffs_ + i] = ftscale *
           filter_coeffs_[i - n_filter_coeffs_by2_ - 1];
      yf_[fft_size_ - n_filter_coeffs_ + i] = 0.0;
    }
    for (i = n_filter_coeffs_by2_; i < (fft_size_-n_filter_coeffs_by2_); i++)
      xf_[i] = yf_[i] = 0.0;
    fft_->fft(xf_, yf_);
  } else { /* Install the magnitude response symmetrically. */
    for (i = 0; i <= n_filter_coeffs_; i++) {
      xf_[i] = ftscale * b[i];
      yf_[i] = 0.0;
    }
    for (; i < fft_size_; i++) {
      xf_[i] = xf_[fft_size_ - i];
      yf_[i] = 0.0;
    }
  }
  /* The filter, regardless of its origin, is now in the frequency domain. */

  if (b_allocated) {
    delete [] b;
  }
}